

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

int cs_impl::file_system::mkdir(char *__path,__mode_t __mode)

{
  long lVar1;
  int iVar2;
  string *__range2;
  long lVar3;
  char *__path_00;
  
  __path_00 = *(char **)__path;
  lVar1 = *(long *)(__path + 8);
  if (lVar1 != 0) {
    lVar3 = 0;
    do {
      if (__path_00[lVar3] == '\\') {
        __path_00[lVar3] = '/';
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    __path_00 = *(char **)__path;
  }
  iVar2 = ::mkdir(__path_00,0x1ed);
  return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0);
}

Assistant:

bool mkdir(std::string path)
		{
			for (auto &ch: path) {
				if (ch == path_separator_reversed)
					ch = cs::path_separator;
			}
			return cs_system_impl::mkdir_impl(path, 0755);
		}